

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::maybeUnblockFlow(RpcConnectionState *this)

{
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_38;
  undefined1 local_21;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_20;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *w;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_w3441;
  RpcConnectionState *this_local;
  
  if ((this->callWordsInFlight < this->flowLimit) &&
     (_w3441 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)this,
     local_20 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->flowWaiter),
     local_20 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0)) {
    w = local_20;
    pPVar1 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_20);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_21);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->flowWaiter,&local_38);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_38);
  }
  return;
}

Assistant:

void maybeUnblockFlow() {
    if (callWordsInFlight < flowLimit) {
      KJ_IF_SOME(w, flowWaiter) {
        w->fulfill();
        flowWaiter = kj::none;
      }
    }
  }